

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ<char[7],std::basic_string_view<char,std::char_traits<char>>>
          (internal *this,char *lhs_expression,char *rhs_expression,char (*lhs) [7],
          basic_string_view<char,_std::char_traits<char>_> *rhs)

{
  int iVar1;
  size_t __n;
  AssertionResult AVar3;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> sVar2
  ;
  
  __n = strlen(*lhs);
  if (__n == rhs->_M_len) {
    if (__n != 0) {
      iVar1 = bcmp(lhs,rhs->_M_str,__n);
      if (iVar1 != 0) goto LAB_0011aab9;
    }
    AVar3 = AssertionSuccess();
    sVar2 = AVar3.message_.ptr_;
  }
  else {
LAB_0011aab9:
    AVar3 = CmpHelperEQFailure<char[7],std::basic_string_view<char,std::char_traits<char>>>
                      (this,lhs_expression,rhs_expression,lhs,rhs);
    sVar2 = AVar3.message_.ptr_;
  }
  AVar3.message_.ptr_ = sVar2.ptr_;
  AVar3._0_8_ = this;
  return AVar3;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            const T1& lhs,
                            const T2& rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return CmpHelperEQFailure(lhs_expression, rhs_expression, lhs, rhs);
}